

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_NoSideEffectsFromTurningOffNewMacros_Test::testBody
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_NoSideEffectsFromTurningOffNewMacros_Test
           *this)

{
  NewDummyClass dummy;
  NewDummyClass local_1;
  
  NewDummyClass::dummyFunction(&local_1);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, NoSideEffectsFromTurningOffNewMacros)
{
    /*
     * Interesting effect of wrapping the operator new around the macro is
     * that the actual new that is called is a different one than expected.
     *
     * The overloaded operator new doesn't actually ever get called.
     *
     * This might come as a surprise, so it is important to realize!
     */
    NewDummyClass dummy;
    dummy.dummyFunction();
    // CHECK(dummy.overloaded_new_called);
}